

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O2

bool __thiscall
tinyusdz::tydra::RenderSceneConverter::ConvertSkelAnimation
          (RenderSceneConverter *this,RenderSceneConverterEnv *env,Path *abs_path,
          SkelAnimation *skelAnim,Animation *anim_out)

{
  TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
  *this_00;
  Stage *pSVar1;
  pointer pSVar2;
  undefined8 uVar3;
  pointer pSVar4;
  pointer pTVar5;
  pointer pqVar6;
  bool bVar7;
  vector<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
  *pvVar8;
  mapped_type *pmVar9;
  mapped_type *pmVar10;
  vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
  *pvVar11;
  pointer paVar12;
  vector<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
  *pvVar13;
  ostream *poVar14;
  mapped_type *pmVar15;
  vector<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
  *pvVar16;
  pointer pfVar17;
  pointer paVar18;
  pointer pfVar19;
  uint64_t val;
  iterator __begin3;
  string *key;
  char *pcVar20;
  key_type *__k;
  size_t j_6;
  char *pcVar21;
  Animation *pAVar22;
  Path *in_R9;
  size_t i;
  long lVar23;
  size_t j_3;
  pointer in;
  pointer in_00;
  size_t j;
  ulong uVar24;
  iterator __end3;
  pointer pqVar25;
  allocator local_3e9;
  vector<float,_std::allocator<float>_> ws;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> joints;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> translation;
  undefined1 local_390 [8];
  vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_> _rotation;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> blendShapes;
  optional<float> local_348;
  string local_338;
  Animation *local_318;
  SkelAnimation *local_310;
  Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
  rotations;
  size_type local_2c0;
  StringAndIdMap jointIdMap;
  Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
  translations;
  Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
  scales;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
  channelMap;
  ostringstream ss_e;
  undefined7 uStack_1a7;
  storage_t<float> sStack_1a4;
  
  joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318 = anim_out;
  bVar7 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::authored
                    (&skelAnim->joints);
  if (bVar7) {
    pSVar1 = env->stage;
    local_310 = skelAnim;
    ::std::__cxx11::string::string((string *)&ss_e,"joints",(allocator *)&jointIdMap);
    pAVar22 = (Animation *)&this->_err;
    bVar7 = EvaluateTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                      (pSVar1,&skelAnim->joints,(string *)&ss_e,&joints,(string *)pAVar22);
    ::std::__cxx11::string::_M_dispose();
    skelAnim = local_310;
    if (bVar7) {
      this_00 = &local_310->rotations;
      bVar7 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
              ::authored(this_00);
      if (bVar7) {
        bVar7 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
                ::authored(&skelAnim->translations);
        if (bVar7) {
          bVar7 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                  ::authored(&skelAnim->scales);
          if (bVar7) goto LAB_0029d83e;
        }
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar14 = ::std::operator<<(poVar14,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 );
      poVar14 = ::std::operator<<(poVar14,":");
      poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
      poVar14 = ::std::operator<<(poVar14,"():");
      poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x1531);
      ::std::operator<<(poVar14," ");
      local_318 = pAVar22;
      ::std::__cxx11::string::string
                ((string *)&translations,
                 "`translations`, `rotations` and `scales` must be all authored for SkelAnimation Prim {}. authored flags: translations {}, rotations {}, scales {}"
                 ,(allocator *)&ws);
      bVar7 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
              ::authored(&skelAnim->translations);
      pcVar20 = "no";
      pcVar21 = "no";
      if (bVar7) {
        pcVar21 = "yes";
      }
      rotations._value.
      super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)pcVar21;
      bVar7 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
              ::authored(this_00);
      pcVar21 = "no";
      if (bVar7) {
        pcVar21 = "yes";
      }
      scales._value.
      super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pcVar21;
      bVar7 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
              ::authored(&skelAnim->scales);
      if (bVar7) {
        pcVar20 = "yes";
      }
      channelMap._M_t._M_impl._0_8_ = pcVar20;
      fmt::format<tinyusdz::Path,char_const*,char_const*,char_const*>
                ((string *)&jointIdMap,(fmt *)&translations,(string *)abs_path,(Path *)&rotations,
                 (char **)&scales,(char **)&channelMap,(char **)abs_path);
      poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&jointIdMap);
      ::std::operator<<(poVar14,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
      pAVar22 = local_318;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar14 = ::std::operator<<(poVar14,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 );
      poVar14 = ::std::operator<<(poVar14,":");
      poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
      poVar14 = ::std::operator<<(poVar14,"():");
      poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x1528);
      ::std::operator<<(poVar14," ");
      ::std::__cxx11::string::string
                ((string *)&translations,"Failed to evaluate `joints` in SkelAnimation Prim : {}",
                 (allocator *)&rotations);
      fmt::format<tinyusdz::Path>((string *)&jointIdMap,(string *)&translations,abs_path);
      poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&jointIdMap);
      ::std::operator<<(poVar14,"\n");
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::stringbuf::str();
    }
    ::std::__cxx11::string::append((string *)pAVar22);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    bVar7 = false;
    goto LAB_0029fb0f;
  }
LAB_0029d83e:
  blendShapes.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  blendShapes.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  blendShapes.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar7 = TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::authored
                    (&skelAnim->blendShapes);
  if (bVar7) {
    pSVar1 = env->stage;
    ::std::__cxx11::string::string((string *)&ss_e,"blendShapes",(allocator *)&jointIdMap);
    bVar7 = EvaluateTypedAttribute<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
                      (pSVar1,&skelAnim->blendShapes,(string *)&ss_e,&blendShapes,&this->_err);
    ::std::__cxx11::string::_M_dispose();
    if (bVar7) {
      bVar7 = TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>::
              authored(&skelAnim->blendShapeWeights);
      if (bVar7) goto LAB_0029d8d0;
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar14 = ::std::operator<<(poVar14,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 );
      poVar14 = ::std::operator<<(poVar14,":");
      poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
      poVar14 = ::std::operator<<(poVar14,"():");
      poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x153d);
      ::std::operator<<(poVar14," ");
      pcVar21 = "`blendShapeWeights` must be authored for SkelAnimation Prim {}";
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
      poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
      poVar14 = ::std::operator<<(poVar14,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 );
      poVar14 = ::std::operator<<(poVar14,":");
      poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
      poVar14 = ::std::operator<<(poVar14,"():");
      poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x1539);
      ::std::operator<<(poVar14," ");
      pcVar21 = "Failed to evaluate `blendShapes` in SkelAnimation Prim : {}";
    }
    ::std::__cxx11::string::string((string *)&translations,pcVar21,(allocator *)&rotations);
    fmt::format<tinyusdz::Path>((string *)&jointIdMap,(string *)&translations,abs_path);
    poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&jointIdMap);
    ::std::operator<<(poVar14,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
    bVar7 = false;
  }
  else {
LAB_0029d8d0:
    pTVar5 = joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
             super__Vector_impl_data._M_finish;
    channelMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &channelMap._M_t._M_impl.super__Rb_tree_header._M_header;
    channelMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    channelMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    channelMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    channelMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         channelMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
        super__Vector_impl_data._M_start) {
LAB_0029f2aa:
      if (blendShapes.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          blendShapes.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
          super__Vector_impl_data._M_start) {
        translations._ts._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)&translations._value.
                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
        translations._value.
        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl
        .super__Vector_impl_data._M_finish._0_2_ = 0;
        translations._value.
        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl
        .super__Vector_impl_data._M_finish._2_2_ = 0;
        translations._value.
        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
        translations._value.
        super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage._2_6_ = 0;
        translations._has_value =
             SUB81(translations._ts._samples.
                   super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_start,0);
        translations._blocked =
             SUB81((ulong)translations._ts._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 8,0);
        translations._26_6_ =
             SUB86((ulong)translations._ts._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 0x10,0);
        translations._ts._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        translations._ts._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        bVar7 = TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>::
                is_value_empty(&skelAnim->blendShapeWeights);
        pTVar5 = blendShapes.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (!bVar7) {
          jointIdMap._s_to_i._M_t._M_impl._0_1_ = 0;
          jointIdMap._s_to_i._M_t._M_impl._1_7_ = 0;
          jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
               jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_color & 0xffffff00
          ;
          jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
          jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0;
          jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_ = 0;
          jointIdMap._i_to_s._M_t._M_impl._0_8_ = 0;
          jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_2_ = _S_red;
          jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_color._2_2_ =
               _S_red >> 0x10;
          jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_2_ = 0;
          jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._2_6_ = 0;
          jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ = '\0';
          jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_1_ = 0;
          bVar7 = TypedAttribute<tinyusdz::Animatable<std::vector<float,_std::allocator<float>_>_>_>
                  ::get_value(&skelAnim->blendShapeWeights,
                              (Animatable<std::vector<float,_std::allocator<float>_>_> *)&jointIdMap
                             );
          if (bVar7) {
            bVar7 = Animatable<std::vector<float,_std::allocator<float>_>_>::has_timesamples
                              ((Animatable<std::vector<float,_std::allocator<float>_>_> *)
                               &jointIdMap);
            if (bVar7) {
              pvVar16 = TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::get_samples
                                  ((TypedTimeSamples<std::vector<float,_std::allocator<float>_>_> *)
                                   &jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header.
                                    _M_right);
              pSVar4 = (pvVar16->
                       super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (in_00 = (pvVar16->
                           super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<float,_std::allocator<float>_>_>::Sample>_>
                           )._M_impl.super__Vector_impl_data._M_start; in_00 != pSVar4;
                  in_00 = in_00 + 1) {
                if (in_00->blocked == false) {
                  pfVar17 = (in_00->value).super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_start;
                  pfVar19 = (in_00->value).super__Vector_base<float,_std::allocator<float>_>._M_impl
                            .super__Vector_impl_data._M_finish;
                  if ((long)pfVar19 - (long)pfVar17 >> 2 !=
                      (long)blendShapes.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)blendShapes.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 5) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar14 = ::std::operator<<(poVar14,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                               );
                    poVar14 = ::std::operator<<(poVar14,":");
                    poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
                    poVar14 = ::std::operator<<(poVar14,"():");
                    poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x1659);
                    ::std::operator<<(poVar14," ");
                    ::std::__cxx11::string::string
                              ((string *)&scales,
                               "Array length mismatch in SkelAnimation. timeCode {} blendShapeWeights.size {} must be equal to blendShapes.size {} : {}"
                               ,(allocator *)&translation);
                    lVar23 = (long)(in_00->value).super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(in_00->value).super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start;
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start._0_4_ = (float)(lVar23 >> 2);
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_ = (float)(lVar23 >> 0x22);
                    local_338._M_dataplus._M_p =
                         (pointer)((long)blendShapes.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)blendShapes.
                                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 5);
                    fmt::format<double,unsigned_long,unsigned_long,tinyusdz::Path>
                              ((string *)&rotations,(fmt *)&scales,(string *)in_00,(double *)&ws,
                               (unsigned_long *)&local_338,(unsigned_long *)abs_path,abs_path);
                    poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&rotations);
                    ::std::operator<<(poVar14,"\n");
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::stringbuf::str();
                    goto LAB_0029f6c0;
                  }
                  lVar23 = 0;
                  for (uVar24 = 0; uVar24 < (ulong)((long)pfVar19 - (long)pfVar17 >> 2);
                      uVar24 = uVar24 + 1) {
                    sStack_1a4 = *(storage_t<float> *)(pfVar17 + uVar24);
                    _ss_e = (float)in_00->t;
                    pmVar15 = ::std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                                            *)&translations,
                                           (key_type *)
                                           ((long)&((blendShapes.
                                                                                                          
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->str_).
                                                  _M_dataplus._M_p + lVar23));
                    ::std::
                    vector<tinyusdz::tydra::AnimationSample<float>,_std::allocator<tinyusdz::tydra::AnimationSample<float>_>_>
                    ::push_back(&pmVar15->samples,(value_type *)&ss_e);
                    pfVar17 = (in_00->value).super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                    pfVar19 = (in_00->value).super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_finish;
                    lVar23 = lVar23 + 0x20;
                  }
                }
              }
            }
            if ((char)jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
                '\x01') {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar14 = ::std::operator<<(poVar14,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                         );
              poVar14 = ::std::operator<<(poVar14,":");
              poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
              poVar14 = ::std::operator<<(poVar14,"():");
              poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x1678);
              ::std::operator<<(poVar14," ");
              pcVar21 = 
              "Internal error. `blendShapeWeights` attribute of SkelAnimation is invalid : {}";
              goto LAB_0029f648;
            }
            ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start._0_4_ = 0.0;
            ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start._4_4_ = 0.0;
            ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish._0_4_ = 0.0;
            ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_finish._4_4_ = 0.0;
            ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            bVar7 = Animatable<std::vector<float,_std::allocator<float>_>_>::get_scalar
                              ((Animatable<std::vector<float,_std::allocator<float>_>_> *)
                               &jointIdMap,&ws);
            if (bVar7) {
              if (CONCAT44(ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish._4_4_,
                           ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish._0_4_) -
                  CONCAT44(ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start._4_4_,
                           ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start._0_4_) >> 2 ==
                  (long)blendShapes.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)blendShapes.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_start >> 5) {
                lVar23 = 0;
                for (uVar24 = 0;
                    uVar24 < (ulong)((long)blendShapes.
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)blendShapes.
                                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                           ._M_impl.super__Vector_impl_data._M_start >> 5);
                    uVar24 = uVar24 + 1) {
                  ss_e = (ostringstream)0x1;
                  sStack_1a4 = *(storage_t<float> *)
                                (CONCAT44(ws.super__Vector_base<float,_std::allocator<float>_>.
                                          _M_impl.super__Vector_impl_data._M_start._4_4_,
                                          ws.super__Vector_base<float,_std::allocator<float>_>.
                                          _M_impl.super__Vector_impl_data._M_start._0_4_) +
                                uVar24 * 4);
                  pmVar15 = ::std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                                          *)&translations,
                                         (key_type *)
                                         ((long)&((blendShapes.
                                                                                                      
                                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->str_).
                                                 _M_dataplus._M_p + lVar23));
                  nonstd::optional_lite::optional<float>::operator=
                            (&pmVar15->static_value,(optional<float> *)&ss_e);
                  lVar23 = lVar23 + 0x20;
                }
                ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                          (&ws.super__Vector_base<float,_std::allocator<float>_>);
                Animatable<std::vector<float,_std::allocator<float>_>_>::~Animatable
                          ((Animatable<std::vector<float,_std::allocator<float>_>_> *)&jointIdMap);
                goto LAB_0029fa45;
              }
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar14 = ::std::operator<<(poVar14,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                         );
              poVar14 = ::std::operator<<(poVar14,":");
              poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
              poVar14 = ::std::operator<<(poVar14,"():");
              poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x1670);
              ::std::operator<<(poVar14," ");
              ::std::__cxx11::string::string
                        ((string *)&scales,
                         "blendShapeWeights.size {} must be equal to blendShapes.size {} : {}",
                         (allocator *)&_rotation);
              local_338._M_dataplus._M_p =
                   (pointer)(CONCAT44(ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_finish._4_4_,
                                      ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_finish._0_4_) -
                             CONCAT44(ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start._4_4_,
                                      ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_start._0_4_) >> 2);
              translation.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)((long)blendShapes.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)blendShapes.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
              fmt::format<unsigned_long,unsigned_long,tinyusdz::Path>
                        ((string *)&rotations,(fmt *)&scales,&local_338,
                         (unsigned_long *)&translation,(unsigned_long *)abs_path,in_R9);
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar14 = ::std::operator<<(poVar14,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                         );
              poVar14 = ::std::operator<<(poVar14,":");
              poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
              poVar14 = ::std::operator<<(poVar14,"():");
              poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x166c);
              ::std::operator<<(poVar14," ");
              ::std::__cxx11::string::string
                        ((string *)&scales,
                         "Failed to get default value of `blendShapeWeights` attribute of SkelAnimation is invalid : {}"
                         ,(allocator *)&local_338);
              fmt::format<tinyusdz::Path>((string *)&rotations,(string *)&scales,abs_path);
            }
            poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&rotations);
            ::std::operator<<(poVar14,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::stringbuf::str();
            ::std::__cxx11::string::append((string *)&this->_err);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            ::std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&ws.super__Vector_base<float,_std::allocator<float>_>);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar14 = ::std::operator<<(poVar14,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                       );
            poVar14 = ::std::operator<<(poVar14,":");
            poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
            poVar14 = ::std::operator<<(poVar14,"():");
            poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x164f);
            ::std::operator<<(poVar14," ");
            pcVar21 = 
            "Failed to get `blendShapeWeights` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
            ;
LAB_0029f648:
            ::std::__cxx11::string::string((string *)&scales,pcVar21,(allocator *)&ws);
            fmt::format<tinyusdz::Path>((string *)&rotations,(string *)&scales,abs_path);
            poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&rotations);
            ::std::operator<<(poVar14,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::stringbuf::str();
LAB_0029f6c0:
            ::std::__cxx11::string::append((string *)&this->_err);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          }
          Animatable<std::vector<float,_std::allocator<float>_>_>::~Animatable
                    ((Animatable<std::vector<float,_std::allocator<float>_>_> *)&jointIdMap);
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
          ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                       *)&translations);
          goto LAB_0029ea64;
        }
        for (__k = &(blendShapes.
                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                     super__Vector_impl_data._M_start)->str_; __k != &pTVar5->str_; __k = __k + 1) {
          ss_e = (ostringstream)0x1;
          sStack_1a4 = (storage_t<float>)0x3f800000;
          pmVar15 = ::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                                  *)&translations,__k);
          nonstd::optional_lite::optional<float>::operator=
                    (&pmVar15->static_value,(optional<float> *)&ss_e);
        }
LAB_0029fa45:
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
        ::_M_move_assign(&(local_318->blendshape_weights_map)._M_t,&translations);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::AnimationSampler<float>_>_>_>
                     *)&translations);
      }
      Path::full_path_name_abi_cxx11_((string *)&ss_e,abs_path);
      pAVar22 = local_318;
      ::std::__cxx11::string::operator=((string *)&local_318->abs_path,(string *)&ss_e);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_assign((string *)pAVar22);
      nonstd::optional_lite::optional<std::__cxx11::string>::value_or<char_const(&)[1]>
                ((value_type *)&ss_e,(optional<std::__cxx11::string> *)&(skelAnim->meta).displayName
                 ,(char (*) [1])0x4a8b33);
      ::std::__cxx11::string::operator=((string *)&pAVar22->display_name,(string *)&ss_e);
      ::std::__cxx11::string::_M_dispose();
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
      ::_M_move_assign(&(pAVar22->channels_map)._M_t,&channelMap);
      bVar7 = true;
    }
    else {
      jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header;
      jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_color._0_2_ = _S_red;
      jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_color._2_2_ =
           _S_red >> 0x10;
      jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._0_2_ = 0;
      jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent._2_6_ = 0;
      jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left._0_1_ =
           (char)jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
      jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left._1_1_ =
           (undefined1)
           ((ulong)jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_right >> 8);
      jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_left._2_6_ =
           (undefined6)
           ((ulong)jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_header._M_right >> 0x10)
      ;
      jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0;
      jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_ = 0;
      jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header;
      jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (key = &(joints.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                   _M_impl.super__Vector_impl_data._M_start)->str_; key != &pTVar5->str_;
          key = key + 1) {
        val = CONCAT71(jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count._1_7_,
                       (undefined1)
                       jointIdMap._i_to_s._M_t._M_impl.super__Rb_tree_header._M_node_count);
        if (val != jointIdMap._s_to_i._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          val = 0;
        }
        StringAndIdMap::add(&jointIdMap,key,val);
      }
      translations._ts._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      translations._ts._17_8_ = 0;
      translations._ts._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      translations._ts._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      translations._ts._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      translations._value.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      translations._value.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish._0_2_ = 0;
      translations._value.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish._2_2_ = 0;
      translations._value.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      translations._value.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
      translations._value.
      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._2_6_ = 0;
      translations._has_value = false;
      translations._blocked = false;
      bVar7 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>_>
              ::get_value(&skelAnim->translations,&translations);
      if (bVar7) {
        rotations._ts._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        rotations._ts._17_8_ = 0;
        rotations._ts._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        rotations._ts._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        rotations._ts._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        rotations._value.
        super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        rotations._value.
        super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>._M_impl.
        super__Vector_impl_data._M_finish._0_2_ = 0;
        rotations._value.
        super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>._M_impl.
        super__Vector_impl_data._M_finish._2_6_ = 0;
        rotations._value.
        super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
        rotations._18_8_ = 0;
        bVar7 = TypedAttribute<tinyusdz::Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>_>
                ::get_value(&skelAnim->rotations,&rotations);
        if (bVar7) {
          scales._ts._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          scales._ts._17_8_ = 0;
          scales._ts._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          scales._ts._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          scales._ts._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          scales._value.
          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          scales._value.
          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_2_ = 0;
          scales._value.
          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._2_6_ = 0;
          scales._value.
          super__Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_2_ = 0;
          scales._18_8_ = 0;
          bVar7 = TypedAttribute<tinyusdz::Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>_>
                  ::get_value(&skelAnim->scales,&scales);
          if (bVar7) {
            bVar7 = Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                    ::has_timesamples(&translations);
            local_310 = skelAnim;
            if (bVar7) {
              pvVar8 = TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                       ::get_samples(&translations._ts);
              if ((pvVar8->
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                  )._M_impl.super__Vector_impl_data._M_start ==
                  (pvVar8->
                  super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar14 = ::std::operator<<(poVar14,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar14 = ::std::operator<<(poVar14,":");
                poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
                poVar14 = ::std::operator<<(poVar14,"():");
                poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x1571);
                ::std::operator<<(poVar14," ");
                ::std::__cxx11::string::string
                          ((string *)&local_338,
                           "`translations` timeSamples in SkelAnimation is empty : {}",
                           (allocator *)&translation);
                fmt::format<tinyusdz::Path>((string *)&ws,&local_338,abs_path);
LAB_0029e9cd:
                poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ws);
                ::std::operator<<(poVar14,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::stringbuf::str();
                goto LAB_0029ea18;
              }
              pvVar8 = TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                       ::get_samples(&translations._ts);
              pSVar2 = (pvVar8->
                       super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (in = (pvVar8->
                        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::Sample>_>
                        )._M_impl.super__Vector_impl_data._M_start; in != pSVar2; in = in + 1) {
                if (in->blocked == false) {
                  paVar12 = (in->value).
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  paVar18 = (in->value).
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if (((long)paVar18 - (long)paVar12) / 0xc !=
                      (long)joints.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)joints.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 5) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar14 = ::std::operator<<(poVar14,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                               );
                    poVar14 = ::std::operator<<(poVar14,":");
                    poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
                    poVar14 = ::std::operator<<(poVar14,"():");
                    poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x1578);
                    ::std::operator<<(poVar14," ");
                    ::std::__cxx11::string::string
                              ((string *)&local_338,
                               "Array length mismatch in SkelAnimation. timeCode {} translations.size {} must be equal to joints.size {} : {}"
                               ,(allocator *)local_390);
                    translation.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)(((long)(in->value).
                                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(in->value).
                                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start) / 0xc);
                    goto LAB_0029e998;
                  }
                  lVar23 = 0;
                  for (uVar24 = 0; uVar24 < (ulong)(((long)paVar18 - (long)paVar12) / 0xc);
                      uVar24 = uVar24 + 1) {
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start._0_4_ = (float)in->t;
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish._4_4_ =
                         *(float *)((long)paVar12->_M_elems + lVar23 + 8);
                    uVar3 = *(undefined8 *)((long)paVar12->_M_elems + lVar23);
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_ = (float)uVar3;
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish._0_4_ = (float)((ulong)uVar3 >> 0x20);
                    StringAndIdMap::at_abi_cxx11_((string *)&ss_e,&jointIdMap,uVar24);
                    pmVar9 = ::std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                             ::operator[](&channelMap,(string *)&ss_e);
                    local_338._M_dataplus._M_p._0_4_ = 1;
                    pmVar10 = ::std::
                              map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                              ::operator[](pmVar9,(key_type *)&local_338);
                    if ((pmVar10->translations).samples.
                        super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start ==
                        (pmVar10->translations).samples.
                        super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      pmVar10->type = Translation;
                    }
                    ::std::
                    vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                    ::push_back(&(pmVar10->translations).samples,(value_type *)&ws);
                    ::std::__cxx11::string::_M_dispose();
                    paVar12 = (in->value).
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    paVar18 = (in->value).
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    lVar23 = lVar23 + 0xc;
                  }
                }
              }
            }
            bVar7 = Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                    ::has_timesamples(&rotations);
            if (bVar7) {
              pvVar11 = TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                        ::get_samples(&rotations._ts);
              pSVar2 = (pointer)(pvVar11->
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                                )._M_impl.super__Vector_impl_data._M_finish;
              for (in = (pointer)(pvVar11->
                                 super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::Sample>_>
                                 )._M_impl.super__Vector_impl_data._M_start; in != pSVar2;
                  in = in + 1) {
                if (in->blocked == false) {
                  paVar12 = (in->value).
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  paVar18 = (in->value).
                            super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if ((long)paVar18 - (long)paVar12 >> 4 !=
                      (long)joints.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)joints.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 5) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar14 = ::std::operator<<(poVar14,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                               );
                    poVar14 = ::std::operator<<(poVar14,":");
                    poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
                    poVar14 = ::std::operator<<(poVar14,"():");
                    poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x1592);
                    ::std::operator<<(poVar14," ");
                    ::std::__cxx11::string::string
                              ((string *)&local_338,
                               "Array length mismatch in SkelAnimation. timeCode {} rotations.size {} must be equal to joints.size {} : {}"
                               ,(allocator *)local_390);
                    translation.
                    super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start =
                         (pointer)((long)(in->value).
                                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(in->value).
                                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 4);
                    goto LAB_0029e998;
                  }
                  lVar23 = 0xc;
                  for (uVar24 = 0; uVar24 < (ulong)((long)paVar18 - (long)paVar12 >> 4);
                      uVar24 = uVar24 + 1) {
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start._0_4_ = (float)in->t;
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_ =
                         *(float *)((long)paVar12[-1]._M_elems + lVar23);
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish._0_4_ =
                         *(float *)((long)paVar12->_M_elems + lVar23 + -8);
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish._4_4_ =
                         *(float *)((long)paVar12->_M_elems + lVar23 + -4);
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage =
                         (pointer)CONCAT44(ws.super__Vector_base<float,_std::allocator<float>_>.
                                           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                           *(undefined4 *)((long)paVar12->_M_elems + lVar23));
                    StringAndIdMap::at_abi_cxx11_((string *)&ss_e,&jointIdMap,uVar24);
                    pmVar9 = ::std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                             ::operator[](&channelMap,(string *)&ss_e);
                    local_338._M_dataplus._M_p._0_4_ = 2;
                    pmVar10 = ::std::
                              map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                              ::operator[](pmVar9,(key_type *)&local_338);
                    if ((pmVar10->rotations).samples.
                        super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start ==
                        (pmVar10->rotations).samples.
                        super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      pmVar10->type = Rotation;
                    }
                    ::std::
                    vector<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_4UL>_>_>_>
                    ::push_back(&(pmVar10->rotations).samples,(value_type *)&ws);
                    ::std::__cxx11::string::_M_dispose();
                    paVar12 = (in->value).
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    paVar18 = (in->value).
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    lVar23 = lVar23 + 0x10;
                  }
                }
              }
            }
            bVar7 = Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                    ::has_timesamples(&scales);
            if (bVar7) {
              pvVar13 = TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                        ::get_samples(&scales._ts);
              in = (pointer)(pvVar13->
                            super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                            )._M_impl.super__Vector_impl_data._M_start;
              pSVar2 = (pointer)(pvVar13->
                                super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>::Sample>_>
                                )._M_impl.super__Vector_impl_data._M_finish;
LAB_0029e443:
              if (in != pSVar2) {
                if (in->blocked != false) goto LAB_0029e458;
                paVar12 = (in->value).
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                paVar18 = (in->value).
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if (((long)paVar18 - (long)paVar12) / 6 ==
                    (long)joints.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)joints.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 5) {
                  lVar23 = 0;
                  for (uVar24 = 0; uVar24 < (ulong)(((long)paVar18 - (long)paVar12) / 6);
                      uVar24 = uVar24 + 1) {
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start._0_4_ = (float)in->t;
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start._4_4_ =
                         tinyusdz::value::half_to_float
                                   ((half)*(uint16_t *)((long)paVar12->_M_elems + lVar23));
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish._0_4_ =
                         tinyusdz::value::half_to_float
                                   ((half)*(uint16_t *)
                                           ((long)((in->value).
                                                                                                      
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar23 + 2));
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish._4_4_ =
                         tinyusdz::value::half_to_float
                                   ((half)*(uint16_t *)
                                           ((long)((in->value).
                                                                                                      
                                                  super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_elems + lVar23 + 4));
                    StringAndIdMap::at_abi_cxx11_((string *)&ss_e,&jointIdMap,uVar24);
                    pmVar9 = ::std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                             ::operator[](&channelMap,(string *)&ss_e);
                    local_338._M_dataplus._M_p._0_4_ = 3;
                    pmVar10 = ::std::
                              map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                              ::operator[](pmVar9,(key_type *)&local_338);
                    if ((pmVar10->scales).samples.
                        super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start ==
                        (pmVar10->scales).samples.
                        super__Vector_base<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
                      pmVar10->type = Scale;
                    }
                    ::std::
                    vector<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>,_std::allocator<tinyusdz::tydra::AnimationSample<std::array<float,_3UL>_>_>_>
                    ::push_back(&(pmVar10->scales).samples,(value_type *)&ws);
                    ::std::__cxx11::string::_M_dispose();
                    paVar12 = (in->value).
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    paVar18 = (in->value).
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                    lVar23 = lVar23 + 6;
                  }
                  goto LAB_0029e458;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar14 = ::std::operator<<(poVar14,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar14 = ::std::operator<<(poVar14,":");
                poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
                poVar14 = ::std::operator<<(poVar14,"():");
                poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x15ae);
                ::std::operator<<(poVar14," ");
                ::std::__cxx11::string::string
                          ((string *)&local_338,
                           "Array length mismatch in SkelAnimation. timeCode {} scales.size {} must be equal to joints.size {} : {}"
                           ,(allocator *)local_390);
                translation.
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (pointer)(((long)(in->value).
                                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(in->value).
                                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 6);
LAB_0029e998:
                _rotation.
                super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)((long)joints.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)joints.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5);
                fmt::format<double,unsigned_long,unsigned_long,tinyusdz::Path>
                          ((string *)&ws,(fmt *)&local_338,(string *)in,(double *)&translation,
                           (unsigned_long *)&_rotation,(unsigned_long *)abs_path,abs_path);
                goto LAB_0029e9cd;
              }
            }
            if (translations._has_value == true) {
              translation.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              translation.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              translation.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              bVar7 = Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                      ::get_scalar(&translations,&translation);
              if (bVar7) {
                if (((long)translation.
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)translation.
                          super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc ==
                    (long)joints.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)joints.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 5) {
                  lVar23 = 0;
                  for (uVar24 = 0;
                      uVar24 < (ulong)((long)joints.
                                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)joints.
                                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5);
                      uVar24 = uVar24 + 1) {
                    StringAndIdMap::at_abi_cxx11_((string *)&ss_e,&jointIdMap,uVar24);
                    pmVar9 = ::std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                             ::operator[](&channelMap,(string *)&ss_e);
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start._0_4_ = 1.4013e-45;
                    pmVar10 = ::std::
                              map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                              ::operator[](pmVar9,(key_type *)&ws);
                    nonstd::optional_lite::optional<std::array<float,3ul>>::operator=
                              ((optional<std::array<float,3ul>> *)&pmVar10->translations,
                               (array<float,_3UL> *)
                               ((long)(translation.
                                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar23
                               ));
                    ::std::__cxx11::string::_M_dispose();
                    lVar23 = lVar23 + 0xc;
                  }
                  ::std::
                  _Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  ~_Vector_base(&translation.
                                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               );
                  goto LAB_0029ebb2;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar14 = ::std::operator<<(poVar14,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar14 = ::std::operator<<(poVar14,":");
                poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
                poVar14 = ::std::operator<<(poVar14,"():");
                poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x15d0);
                ::std::operator<<(poVar14," ");
                ::std::__cxx11::string::string
                          ((string *)&local_338,
                           "Array length mismatch in SkelAnimation. translations.default.size {} must be equal to joints.size {} : {}"
                           ,(allocator *)&local_2c0);
                _rotation.
                super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
                _M_impl.super__Vector_impl_data._M_start =
                     (pointer)(((long)translation.
                                      super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)translation.
                                     super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0xc);
                local_390 = (undefined1  [8])
                            ((long)joints.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)joints.
                                   super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5);
                fmt::format<unsigned_long,unsigned_long,tinyusdz::Path>
                          ((string *)&ws,(fmt *)&local_338,(string *)&_rotation,
                           (unsigned_long *)local_390,(unsigned_long *)abs_path,in_R9);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar14 = ::std::operator<<(poVar14,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar14 = ::std::operator<<(poVar14,":");
                poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
                poVar14 = ::std::operator<<(poVar14,"():");
                poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x15cd);
                ::std::operator<<(poVar14," ");
                ::std::__cxx11::string::string
                          ((string *)&local_338,
                           "Failed to get `translations` attribute in SkelAnimation: {}",
                           (allocator *)&_rotation);
                fmt::format<tinyusdz::Path>((string *)&ws,&local_338,abs_path);
              }
              poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ws);
              ::std::operator<<(poVar14,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::append((string *)&this->_err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
            }
            else {
LAB_0029ebb2:
              if (rotations._has_value == true) {
                translation.
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                translation.
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                translation.
                super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                _rotation.
                super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
                _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                _rotation.
                super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
                _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                _rotation.
                super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                bVar7 = Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                        ::get_scalar(&rotations,&_rotation);
                pqVar6 = _rotation.
                         super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (bVar7) {
                  if ((long)_rotation.
                            super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)_rotation.
                            super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4 ==
                      (long)joints.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)joints.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 5) {
                    for (pqVar25 = _rotation.
                                   super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                   ._M_impl.super__Vector_impl_data._M_start; pqVar25 != pqVar6;
                        pqVar25 = pqVar25 + 1) {
                      _ss_e = *(optional<float> *)(pqVar25->imag)._M_elems;
                      ::std::vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>::
                      emplace_back<std::array<float,4ul>>
                                ((vector<std::array<float,4ul>,std::allocator<std::array<float,4ul>>>
                                  *)&translation,(array<float,_4UL> *)&ss_e);
                    }
                    lVar23 = 0;
                    for (uVar24 = 0;
                        uVar24 < (ulong)((long)joints.
                                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)joints.
                                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 5);
                        uVar24 = uVar24 + 1) {
                      StringAndIdMap::at_abi_cxx11_((string *)&ss_e,&jointIdMap,uVar24);
                      pmVar9 = ::std::
                               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                               ::operator[](&channelMap,(string *)&ss_e);
                      ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start._0_4_ = 2.8026e-45;
                      pmVar10 = ::std::
                                map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                                ::operator[](pmVar9,(key_type *)&ws);
                      nonstd::optional_lite::optional<std::array<float,4ul>>::operator=
                                ((optional<std::array<float,4ul>> *)&pmVar10->rotations,
                                 (array<float,_4UL> *)
                                 ((long)(translation.
                                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                                 lVar23));
                      ::std::__cxx11::string::_M_dispose();
                      lVar23 = lVar23 + 0x10;
                    }
                    ::std::
                    _Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>::
                    ~_Vector_base(&_rotation.
                                   super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                 );
                    ::std::
                    _Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
                    ~_Vector_base((_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                                   *)&translation);
                    goto LAB_0029eeea;
                  }
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar14 = ::std::operator<<(poVar14,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                             );
                  poVar14 = ::std::operator<<(poVar14,":");
                  poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
                  poVar14 = ::std::operator<<(poVar14,"():");
                  poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x15e2);
                  ::std::operator<<(poVar14," ");
                  ::std::__cxx11::string::string
                            ((string *)&local_338,
                             "Array length mismatch in SkelAnimation. rotations.default.size {} must be equal to joints.size {} : {}"
                             ,&local_3e9);
                  local_390 = (undefined1  [8])
                              ((long)_rotation.
                                     super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)_rotation.
                                     super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 4);
                  local_2c0 = (long)joints.
                                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)joints.
                                    super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5;
                  fmt::format<unsigned_long,unsigned_long,tinyusdz::Path>
                            ((string *)&ws,(fmt *)&local_338,(string *)local_390,&local_2c0,
                             (unsigned_long *)abs_path,in_R9);
                }
                else {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                  poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                  poVar14 = ::std::operator<<(poVar14,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                             );
                  poVar14 = ::std::operator<<(poVar14,":");
                  poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
                  poVar14 = ::std::operator<<(poVar14,"():");
                  poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x15df);
                  ::std::operator<<(poVar14," ");
                  ::std::__cxx11::string::string
                            ((string *)&local_338,
                             "Failed to get `rotations` attribute in SkelAnimation: {}",
                             (allocator *)local_390);
                  fmt::format<tinyusdz::Path>((string *)&ws,&local_338,abs_path);
                }
                poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ws);
                ::std::operator<<(poVar14,"\n");
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::stringbuf::str();
                ::std::__cxx11::string::append((string *)&this->_err);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                ::std::_Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                ::~_Vector_base(&_rotation.
                                 super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                               );
                ::std::
                _Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>::
                ~_Vector_base((_Vector_base<std::array<float,_4UL>,_std::allocator<std::array<float,_4UL>_>_>
                               *)&translation);
                goto LAB_0029ea30;
              }
LAB_0029eeea:
              if (scales._has_value != true) {
LAB_0029f26e:
                Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                ::~Animatable(&scales);
                Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>
                ::~Animatable(&rotations);
                Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
                ::~Animatable(&translations);
                StringAndIdMap::~StringAndIdMap(&jointIdMap);
                skelAnim = local_310;
                goto LAB_0029f2aa;
              }
              translation.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              translation.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              translation.
              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              _rotation.
              super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              _rotation.
              super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              _rotation.
              super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              bVar7 = Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
                      ::get_scalar(&scales,(vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                            *)&_rotation);
              pqVar6 = _rotation.
                       super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (bVar7) {
                if (((long)_rotation.
                           super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)_rotation.
                          super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 6 ==
                    (long)joints.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)joints.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 5) {
                  for (pqVar25 = _rotation.
                                 super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                 ._M_impl.super__Vector_impl_data._M_start; pqVar25 != pqVar6;
                      pqVar25 = (pointer)((long)(pqVar25->imag)._M_elems + 6)) {
                    local_348._0_4_ =
                         tinyusdz::value::half_to_float((half)*(uint16_t *)(pqVar25->imag)._M_elems)
                    ;
                    local_348.contained =
                         (storage_t<float>)
                         tinyusdz::value::half_to_float
                                   ((half)*(uint16_t *)((long)(pqVar25->imag)._M_elems + 2));
                    tinyusdz::value::half_to_float
                              ((half)*(uint16_t *)((pqVar25->imag)._M_elems + 1));
                    _ss_e = local_348;
                    ::std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>::
                    emplace_back<std::array<float,3ul>>
                              ((vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>
                                *)&translation,(array<float,_3UL> *)&ss_e);
                  }
                  lVar23 = 0;
                  for (uVar24 = 0;
                      uVar24 < (ulong)((long)joints.
                                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)joints.
                                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5);
                      uVar24 = uVar24 + 1) {
                    StringAndIdMap::at_abi_cxx11_((string *)&ss_e,&jointIdMap,uVar24);
                    pmVar9 = ::std::
                             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
                             ::operator[](&channelMap,(string *)&ss_e);
                    ws.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start._0_4_ = 4.2039e-45;
                    pmVar10 = ::std::
                              map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>
                              ::operator[](pmVar9,(key_type *)&ws);
                    nonstd::optional_lite::optional<std::array<float,3ul>>::operator=
                              ((optional<std::array<float,3ul>> *)&pmVar10->scales,
                               (array<float,_3UL> *)
                               ((long)(translation.
                                       super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar23
                               ));
                    ::std::__cxx11::string::_M_dispose();
                    lVar23 = lVar23 + 0xc;
                  }
                  ::std::
                  _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                  ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                                   *)&_rotation);
                  ::std::
                  _Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                  ~_Vector_base(&translation.
                                 super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                               );
                  goto LAB_0029f26e;
                }
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar14 = ::std::operator<<(poVar14,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar14 = ::std::operator<<(poVar14,":");
                poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
                poVar14 = ::std::operator<<(poVar14,"():");
                poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x15fd);
                ::std::operator<<(poVar14," ");
                ::std::__cxx11::string::string
                          ((string *)&local_338,
                           "Array length mismatch in SkelAnimation. scale.default.size {} must be equal to joints.size {} : {}"
                           ,&local_3e9);
                local_390 = (undefined1  [8])
                            (((long)_rotation.
                                    super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)_rotation.
                                   super__Vector_base<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 6);
                local_2c0 = (long)joints.
                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)joints.
                                  super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 5;
                fmt::format<unsigned_long,unsigned_long,tinyusdz::Path>
                          ((string *)&ws,(fmt *)&local_338,(string *)local_390,&local_2c0,
                           (unsigned_long *)abs_path,in_R9);
              }
              else {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar14 = ::std::operator<<(poVar14,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar14 = ::std::operator<<(poVar14,":");
                poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
                poVar14 = ::std::operator<<(poVar14,"():");
                poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x15fa);
                ::std::operator<<(poVar14," ");
                ::std::__cxx11::string::string
                          ((string *)&local_338,
                           "Failed to get `scales` attribute in SkelAnimation: {}",
                           (allocator *)local_390);
                fmt::format<tinyusdz::Path>((string *)&ws,&local_338,abs_path);
              }
              poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ws);
              ::std::operator<<(poVar14,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::append((string *)&this->_err);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              ::std::
              _Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
              ::~_Vector_base((_Vector_base<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>
                               *)&_rotation);
            }
            ::std::_Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
            ~_Vector_base(&translation.
                           super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         );
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
            poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
            poVar14 = ::std::operator<<(poVar14,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                       );
            poVar14 = ::std::operator<<(poVar14,":");
            poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
            poVar14 = ::std::operator<<(poVar14,"():");
            poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x155e);
            ::std::operator<<(poVar14," ");
            ::std::__cxx11::string::string
                      ((string *)&local_338,
                       "Failed to get `scales` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
                       ,(allocator *)&translation);
            fmt::format<tinyusdz::Path>((string *)&ws,&local_338,abs_path);
            poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&ws);
            ::std::operator<<(poVar14,"\n");
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::stringbuf::str();
LAB_0029ea18:
            ::std::__cxx11::string::append((string *)&this->_err);
            ::std::__cxx11::string::_M_dispose();
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
          }
LAB_0029ea30:
          Animatable<std::vector<std::array<tinyusdz::value::half,_3UL>,_std::allocator<std::array<tinyusdz::value::half,_3UL>_>_>_>
          ::~Animatable(&scales);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar14 = ::std::operator<<(poVar14,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                     );
          poVar14 = ::std::operator<<(poVar14,":");
          poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
          poVar14 = ::std::operator<<(poVar14,"():");
          poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x1559);
          ::std::operator<<(poVar14," ");
          ::std::__cxx11::string::string
                    ((string *)&ws,
                     "Failed to get `rotations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
                     ,(allocator *)&local_338);
          fmt::format<tinyusdz::Path>((string *)&scales,(string *)&ws,abs_path);
          poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&scales);
          ::std::operator<<(poVar14,"\n");
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::append((string *)&this->_err);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
        }
        Animatable<std::vector<tinyusdz::value::quatf,_std::allocator<tinyusdz::value::quatf>_>_>::
        ~Animatable(&rotations);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
        poVar14 = ::std::operator<<((ostream *)&ss_e,"[error]");
        poVar14 = ::std::operator<<(poVar14,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                   );
        poVar14 = ::std::operator<<(poVar14,":");
        poVar14 = ::std::operator<<(poVar14,"ConvertSkelAnimation");
        poVar14 = ::std::operator<<(poVar14,"():");
        poVar14 = (ostream *)::std::ostream::operator<<(poVar14,0x1554);
        ::std::operator<<(poVar14," ");
        ::std::__cxx11::string::string
                  ((string *)&scales,
                   "Failed to get `translations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}"
                   ,(allocator *)&ws);
        fmt::format<tinyusdz::Path>((string *)&rotations,(string *)&scales,abs_path);
        poVar14 = ::std::operator<<((ostream *)&ss_e,(string *)&rotations);
        ::std::operator<<(poVar14,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::append((string *)&this->_err);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      }
      Animatable<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>::
      ~Animatable(&translations);
      StringAndIdMap::~StringAndIdMap(&jointIdMap);
LAB_0029ea64:
      bVar7 = false;
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel,_std::less<tinyusdz::tydra::AnimationChannel::ChannelType>,_std::allocator<std::pair<const_tinyusdz::tydra::AnimationChannel::ChannelType,_tinyusdz::tydra::AnimationChannel>_>_>_>_>_>
    ::~_Rb_tree(&channelMap._M_t);
  }
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&blendShapes);
LAB_0029fb0f:
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&joints);
  return bVar7;
LAB_0029e458:
  in = in + 1;
  goto LAB_0029e443;
}

Assistant:

bool RenderSceneConverter::ConvertSkelAnimation(const RenderSceneConverterEnv &env,
                                            const Path &abs_path,
                                            const SkelAnimation &skelAnim,
                                            Animation *anim_out) {
  // The spec says
  // """
  // An animation source is only valid if its translation, rotation, and scale components are all authored, storing arrays size to the same size as the authored joints array.
  // """
  //
  // SkelAnimation contains
  // - Joint animations(translation, rotation, scale)
  // - BlendShape animations(weights)

  std::vector<value::token> joints;

  if (skelAnim.joints.authored()) {
    if (!EvaluateTypedAttribute(env.stage, skelAnim.joints, "joints", &joints, &_err)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to evaluate `joints` in SkelAnimation Prim : {}", abs_path));
    }

    if (!skelAnim.rotations.authored() ||
        !skelAnim.translations.authored() ||
        !skelAnim.scales.authored()) {

      PUSH_ERROR_AND_RETURN(fmt::format("`translations`, `rotations` and `scales` must be all authored for SkelAnimation Prim {}. authored flags: translations {}, rotations {}, scales {}", abs_path, skelAnim.translations.authored() ? "yes" : "no",
      skelAnim.rotations.authored() ? "yes" : "no",
      skelAnim.scales.authored() ? "yes" : "no"));
    }
  }

  // TODO: inbetweens BlendShape
  std::vector<value::token> blendShapes;
  if (skelAnim.blendShapes.authored()) {
    if (!EvaluateTypedAttribute(env.stage, skelAnim.blendShapes, "blendShapes", &blendShapes, &_err)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to evaluate `blendShapes` in SkelAnimation Prim : {}", abs_path));
    }

    if (!skelAnim.blendShapeWeights.authored()) {
      PUSH_ERROR_AND_RETURN(fmt::format("`blendShapeWeights` must be authored for SkelAnimation Prim {}", abs_path));
    }

  }


  //
  // Reorder values[channels][timeCode][jointId] into values[jointId][channels][timeCode]
  //

  std::map<std::string, std::map<AnimationChannel::ChannelType, AnimationChannel>> channelMap;

  // Joint animations
  if (joints.size()) {
    StringAndIdMap jointIdMap;

    for (const auto &joint : joints) {
      uint64_t id = jointIdMap.size();
      jointIdMap.add(joint.str(), id);
    }

    Animatable<std::vector<value::float3>> translations;
    if (!skelAnim.translations.get_value(&translations)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `translations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
    }

    Animatable<std::vector<value::quatf>> rotations;
    if (!skelAnim.rotations.get_value(&rotations)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `rotations` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
    }

    Animatable<std::vector<value::half3>> scales;
    if (!skelAnim.scales.get_value(&scales)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `scales` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
    }

    DCOUT("translations: has_timesamples " << translations.has_timesamples());
    DCOUT("translations: has_default " << translations.has_default());
    DCOUT("rotations: has_timesamples " << rotations.has_timesamples());
    DCOUT("rotations: has_default " << rotations.has_default());
    DCOUT("scales: has_timesamples " << scales.has_timesamples());
    DCOUT("scales: has_default " << scales.has_default());

    //
    // timesamples value
    //

    if (translations.has_timesamples()) {
      DCOUT("Convert ttranslations");
      const TypedTimeSamples<std::vector<value::float3>> &ts_txs = translations.get_timesamples();

      if (ts_txs.get_samples().empty()) {
        PUSH_ERROR_AND_RETURN(fmt::format("`translations` timeSamples in SkelAnimation is empty : {}", abs_path));
      }

      for (const auto &sample : ts_txs.get_samples()) {
        if (!sample.blocked) {
          // length check
          if (sample.value.size() != joints.size()) {
            PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} translations.size {} must be equal to joints.size {} : {}", sample.t, sample.value.size(), joints.size(), abs_path));
          }

          for (size_t j = 0; j < sample.value.size(); j++) {
            AnimationSample<value::float3> s;
            s.t = float(sample.t);
            s.value = sample.value[j];

            std::string jointName = jointIdMap.at(j);
            auto &it = channelMap[jointName][AnimationChannel::ChannelType::Translation];
            if (it.translations.samples.empty()) {
              it.type = AnimationChannel::ChannelType::Translation;
            }
            it.translations.samples.push_back(s);
          }

        }
      }
    }

    if (rotations.has_timesamples()) {
      const TypedTimeSamples<std::vector<value::quatf>> &ts_rots = rotations.get_timesamples();
      DCOUT("Convert rotations");
      for (const auto &sample : ts_rots.get_samples()) {
        if (!sample.blocked) {
          if (sample.value.size() != joints.size()) {
            PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} rotations.size {} must be equal to joints.size {} : {}", sample.t, sample.value.size(), joints.size(), abs_path));
          }
          for (size_t j = 0; j < sample.value.size(); j++) {
            AnimationSample<value::float4> s;
            s.t = float(sample.t);
            s.value[0] = sample.value[j][0];
            s.value[1] = sample.value[j][1];
            s.value[2] = sample.value[j][2];
            s.value[3] = sample.value[j][3];

            std::string jointName = jointIdMap.at(j);
            auto &it = channelMap[jointName][AnimationChannel::ChannelType::Rotation];
            if (it.rotations.samples.empty()) {
              it.type = AnimationChannel::ChannelType::Rotation;
            }
            it.rotations.samples.push_back(s);
          }

        }
      }
    }

    if (scales.has_timesamples()) {
      const TypedTimeSamples<std::vector<value::half3>> &ts_scales = scales.get_timesamples();
      DCOUT("Convert scales");
      for (const auto &sample : ts_scales.get_samples()) {
        if (!sample.blocked) {
          if (sample.value.size() != joints.size()) {
            PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} scales.size {} must be equal to joints.size {} : {}", sample.t, sample.value.size(), joints.size(), abs_path));
          }

          for (size_t j = 0; j < sample.value.size(); j++) {
            AnimationSample<value::float3> s;
            s.t = float(sample.t);
            s.value[0] = value::half_to_float(sample.value[j][0]);
            s.value[1] = value::half_to_float(sample.value[j][1]);
            s.value[2] = value::half_to_float(sample.value[j][2]);

            std::string jointName = jointIdMap.at(j);
            auto &it = channelMap[jointName][AnimationChannel::ChannelType::Scale];
            if (it.scales.samples.empty()) {
              it.type = AnimationChannel::ChannelType::Scale;
            }
            it.scales.samples.push_back(s);
          }

        }
      }
    }

    //
    // value at 'default' time.
    //

    // Get value and also do length check for scalar(non timeSampled) animation value.
    if (translations.has_default()) {
      DCOUT("translation at default time");
      std::vector<value::float3> translation;
      if (!translations.get_scalar(&translation)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `translations` attribute in SkelAnimation: {}", abs_path));
      }
      if (translation.size() != joints.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. translations.default.size {} must be equal to joints.size {} : {}", translation.size(), joints.size(), abs_path));
      }

      for (size_t j = 0; j < joints.size(); j++) {
        std::string jointName = jointIdMap.at(j);
        auto &it = channelMap[jointName][AnimationChannel::ChannelType::Translation];
        it.translations.static_value = translation[j];
      }
    }

    if (rotations.has_default()) {
      DCOUT("rotations at default time");
      std::vector<value::float4> rotation;
      std::vector<value::quatf> _rotation;
      if (!rotations.get_scalar(&_rotation)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `rotations` attribute in SkelAnimation: {}", abs_path));
      }
      if (_rotation.size() != joints.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. rotations.default.size {} must be equal to joints.size {} : {}", _rotation.size(), joints.size(), abs_path));
      }
      std::transform(_rotation.begin(), _rotation.end(), std::back_inserter(rotation), [](const value::quatf &v) {
        value::float4 ret;
        // pxrUSD's TfQuat also uses xyzw memory order.
        ret[0] = v[0];
        ret[1] = v[1];
        ret[2] = v[2];
        ret[3] = v[3];
        return ret;
      });

      for (size_t j = 0; j < joints.size(); j++) {
        std::string jointName = jointIdMap.at(j);
        auto &it = channelMap[jointName][AnimationChannel::ChannelType::Rotation];
        it.rotations.static_value = rotation[j];
      }
    }

    if (scales.has_default()) {
      DCOUT("scales at default time");
      std::vector<value::float3> scale;
      std::vector<value::half3> _scale;
      if (!scales.get_scalar(&_scale)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `scales` attribute in SkelAnimation: {}", abs_path));
      }
      if (_scale.size() != joints.size()) {
        PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. scale.default.size {} must be equal to joints.size {} : {}", _scale.size(), joints.size(), abs_path));
      }
      // half -> float
      std::transform(_scale.begin(), _scale.end(), std::back_inserter(scale), [](const value::half3 &v) {
        value::float3 ret;
        ret[0] = value::half_to_float(v[0]);
        ret[1] = value::half_to_float(v[1]);
        ret[2] = value::half_to_float(v[2]);
        return ret;
      });
      for (size_t j = 0; j < joints.size(); j++) {
        std::string jointName = jointIdMap.at(j);
        auto &it = channelMap[jointName][AnimationChannel::ChannelType::Scale];
        it.scales.static_value = scale[j];
      }
    }


#if 0 // TODO: remove
    if (!is_translations_timesamples) {
      DCOUT("Reorder translation samples");
      // Create a channel value with single-entry
      // Use USD TimeCode::Default for static sample.
      for (const auto &joint : joints) {
        channelMap[joint.str()][AnimationChannel::ChannelType::Translation].type = AnimationChannel::ChannelType::Translation;

        AnimationSample<value::float3> s;
        s.t = std::numeric_limits<float>::quiet_NaN();
        uint64_t joint_id = jointIdMap.at(joint.str());
        s.value = translation[joint_id];
        channelMap[joint.str()][AnimationChannel::ChannelType::Translation].translations.samples.clear();
        channelMap[joint.str()][AnimationChannel::ChannelType::Translation].translations.samples.push_back(s);
      }
    }

    if (!is_rotations_timesamples) {
      DCOUT("Reorder rotation samples");
      for (const auto &joint : joints) {
        channelMap[joint.str()][AnimationChannel::ChannelType::Rotation].type = AnimationChannel::ChannelType::Rotation;

        AnimationSample<value::float4> s;
        s.t = std::numeric_limits<float>::quiet_NaN();
        uint64_t joint_id = jointIdMap.at(joint.str());
        DCOUT("rot joint_id " << joint_id);
        s.value = rotation[joint_id];
        channelMap[joint.str()][AnimationChannel::ChannelType::Rotation].rotations.samples.clear();
        channelMap[joint.str()][AnimationChannel::ChannelType::Rotation].rotations.samples.push_back(s);
      }
    }

    if (!is_scales_timesamples) {
      DCOUT("Reorder scale samples");
      for (const auto &joint : joints) {
        channelMap[joint.str()][AnimationChannel::ChannelType::Scale].type = AnimationChannel::ChannelType::Scale;

        AnimationSample<value::float3> s;
        s.t = std::numeric_limits<float>::quiet_NaN();
        uint64_t joint_id = jointIdMap.at(joint.str());
        s.value = scale[joint_id];
        channelMap[joint.str()][AnimationChannel::ChannelType::Scale].scales.samples.clear();
        channelMap[joint.str()][AnimationChannel::ChannelType::Scale].scales.samples.push_back(s);
      }
    }
#endif
  }

  // BlendShape animations
  if (blendShapes.size()) {

    std::map<std::string, AnimationSampler<float>> weightsMap;

    // Blender 4.1 may export empty bendShapeWeights. We'll accept it.
    //
    // float[] blendShapeWeights
    if (skelAnim.blendShapeWeights.is_value_empty()) {
      for (const auto &bs : blendShapes) {
        weightsMap[bs.str()].static_value = 1.0f;
      }
    } else {

      Animatable<std::vector<float>> weights;
      if (!skelAnim.blendShapeWeights.get_value(&weights)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to get `blendShapeWeights` attribute of SkelAnimation. Maybe ValueBlock or connection? : {}", abs_path));
      }

      if (weights.has_timesamples()) {

        const TypedTimeSamples<std::vector<float>> &ts_weights = weights.get_timesamples();
        DCOUT("Convert timeSampledd weights");
        for (const auto &sample : ts_weights.get_samples()) {
          if (!sample.blocked) {
            if (sample.value.size() != blendShapes.size()) {
              PUSH_ERROR_AND_RETURN(fmt::format("Array length mismatch in SkelAnimation. timeCode {} blendShapeWeights.size {} must be equal to blendShapes.size {} : {}", sample.t, sample.value.size(), blendShapes.size(), abs_path));
            }

            for (size_t j = 0; j < sample.value.size(); j++) {
              AnimationSample<float> s;
              s.t = float(sample.t);
              s.value = sample.value[j];

              const std::string &targetName = blendShapes[j].str();
              weightsMap[targetName].samples.push_back(s);
            }

          }
        }
      }

      if (weights.has_default()) {
        std::vector<float> ws;
        if (!weights.get_scalar(&ws)) {
          PUSH_ERROR_AND_RETURN(fmt::format("Failed to get default value of `blendShapeWeights` attribute of SkelAnimation is invalid : {}", abs_path));
        }

        if (ws.size() != blendShapes.size()) {
          PUSH_ERROR_AND_RETURN(fmt::format("blendShapeWeights.size {} must be equal to blendShapes.size {} : {}", ws.size(), blendShapes.size(), abs_path));
        }

        for (size_t i = 0; i < blendShapes.size(); i++) {
          weightsMap[blendShapes[i].str()].static_value = ws[i];
        }

      } else {
        PUSH_ERROR_AND_RETURN(fmt::format("Internal error. `blendShapeWeights` attribute of SkelAnimation is invalid : {}", abs_path));
      }

    }

    anim_out->blendshape_weights_map = std::move(weightsMap);
  }

  anim_out->abs_path = abs_path.full_path_name();
  anim_out->prim_name = skelAnim.name;
  anim_out->display_name = skelAnim.metas().displayName.value_or("");

  anim_out->channels_map = std::move(channelMap);

  return true;
}